

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * arena_bin_malloc_hard(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,uint binshard)

{
  extent_heap_t *peVar1;
  witness_t **ppwVar2;
  uint64_t *puVar3;
  size_t *psVar4;
  long *plVar5;
  extent_t *peVar6;
  witness_t *pwVar7;
  ulong size;
  extent_t *peVar8;
  extent_t *peVar9;
  tsdn_t *ptVar10;
  int iVar11;
  szind_t sVar12;
  arena_t *arena_00;
  long lVar13;
  void *pvVar14;
  undefined4 extraout_var;
  uint *bin_00;
  long lVar15;
  mutex_prof_data_t *data;
  undefined4 in_register_00000084;
  bin_info_t *bin_info;
  _Bool zero;
  _Bool local_63;
  _Bool local_62;
  _Bool zero_1;
  tsdn_t *local_60;
  extent_hooks_t *extent_hooks;
  ulong local_50;
  extent_heap_t *local_48;
  pthread_mutex_t *local_40;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000084,binshard);
  bin_00 = &manual_arena_base;
  if ((manual_arena_base <= arena->base->ind) && (peVar6 = bin->slabcur, peVar6 != (extent_t *)0x0))
  {
    bin_00 = (uint *)(bin->slabs_full).qlh_first;
    if ((bin_t *)bin_00 != (bin_t *)0x0) {
      pwVar7 = (((bin_t *)bin_00)->lock).field_0.witness.link.qre_next;
      ((anon_struct_16_2_f62ecd99_for_link *)&(peVar6->ql_link).qre_prev)->qre_next = pwVar7;
      (peVar6->ql_link).qre_next = (extent_t *)bin_00;
      pwVar7->opaque = peVar6;
      (((bin_t *)bin_00)->lock).field_0.witness.link.qre_next = (witness_t *)peVar6;
    }
    (bin->slabs_full).qlh_first = (peVar6->ql_link).qre_next;
    bin->slabcur = (extent_t *)0x0;
  }
  peVar1 = &bin->slabs_nonfull;
  local_60 = tsdn;
  arena_00 = (arena_t *)extent_heap_remove_first(peVar1);
  if (arena_00 == (arena_t *)0x0) {
    arena_00 = (arena_t *)0x0;
  }
  else {
    puVar3 = &(bin->stats).reslabs;
    *puVar3 = *puVar3 + 1;
    psVar4 = &(bin->stats).nonfull_slabs;
    *psVar4 = *psVar4 - 1;
  }
  bin_info = bin_infos + binind;
  if (arena_00 != (arena_t *)0x0) goto LAB_00118153;
  (bin->lock).field_0.field_0.locked.repr = false;
  local_40 = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40);
  pthread_mutex_unlock(local_40);
  extent_hooks = (extent_hooks_t *)0x0;
  size = bin_info->reg_size;
  local_48 = peVar1;
  if (size < 0x1001) {
    local_50 = (ulong)sz_size2index_tab[size + 7 >> 3];
  }
  else {
    sVar12 = sz_size2index_compute(size);
    local_50 = CONCAT44(extraout_var,sVar12);
  }
  zero = false;
  local_63 = true;
  arena_00 = (arena_t *)
             extents_alloc(local_60,arena,&extent_hooks,&arena->extents_dirty,(void *)0x0,
                           bin_infos[binind].slab_size,0,0x1000,true,binind,&zero,&local_63);
  if (arena_00 == (arena_t *)0x0) {
    if ((arena->decay_muzzy).time_ms.repr == 0) {
      arena_00 = (arena_t *)0x0;
    }
    else {
      arena_00 = (arena_t *)
                 extents_alloc(local_60,arena,&extent_hooks,&arena->extents_muzzy,(void *)0x0,
                               bin_infos[binind].slab_size,0,0x1000,true,binind,&zero,&local_63);
    }
  }
  peVar1 = local_48;
  ptVar10 = local_60;
  if (arena_00 == (arena_t *)0x0) {
    zero_1 = false;
    local_62 = true;
    bin_00 = (uint *)0x0;
    arena_00 = (arena_t *)
               extent_alloc_wrapper
                         (local_60,arena,&extent_hooks,(void *)0x0,bin_infos[binind].slab_size,0,
                          0x1000,true,(szind_t)local_50,&zero_1,&local_62);
    if (arena_00 != (arena_t *)0x0) {
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr + bin_infos[binind].slab_size;
      UNLOCK();
      goto LAB_0011809a;
    }
    arena_00 = (arena_t *)0x0;
  }
  else {
LAB_0011809a:
    bin_00 = (uint *)(*(ulong *)arena_00->nthreads & 0xfffffc0003ffffff);
    *(ulong *)arena_00->nthreads =
         (ulong)bin_infos[binind].nregs << 0x1a | local_38 << 0x24 | (ulong)bin_00;
    bitmap_init(&(arena_00->stats).decay_dirty.purged.repr,&bin_infos[binind].bitmap_info,false);
    LOCK();
    (arena->nactive).repr =
         (arena->nactive).repr +
         (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&arena_00->last_thd)->e_size_esn >> 0xc);
    UNLOCK();
  }
  iVar11 = pthread_mutex_trylock(local_40);
  if (iVar11 != 0) {
    malloc_mutex_lock_slow(&bin->lock);
    (bin->lock).field_0.field_0.locked.repr = true;
  }
  puVar3 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar3 = *puVar3 + 1;
  if ((bin->lock).field_0.field_0.prof_data.prev_owner != ptVar10) {
    *(tsdn_t **)((long)&(bin->lock).field_0 + 0x30) = ptVar10;
    ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (arena_00 == (arena_t *)0x0) {
    arena_00 = (arena_t *)extent_heap_remove_first(peVar1);
    if (arena_00 == (arena_t *)0x0) {
      arena_00 = (arena_t *)0x0;
      goto LAB_00118153;
    }
    lVar13 = -1;
    bin_00 = (uint *)0xd0;
    lVar15 = 0xc0;
  }
  else {
    lVar13 = 1;
    bin_00 = (uint *)0xc8;
    lVar15 = 0xb8;
  }
  plVar5 = (long *)((long)&(bin->lock).field_0 + lVar15);
  *plVar5 = *plVar5 + 1;
  plVar5 = (long *)((long)&(bin->lock).field_0 + (long)&(((bin_t *)bin_00)->lock).field_0);
  *plVar5 = *plVar5 + lVar13;
LAB_00118153:
  peVar6 = bin->slabcur;
  if (peVar6 != (extent_t *)0x0) {
    if ((peVar6->e_bits & 0xffc000000) != 0) {
      pvVar14 = arena_slab_reg_alloc(peVar6,bin_info);
      if (arena_00 == (arena_t *)0x0) {
        return pvVar14;
      }
      if (((uint)(*(ulong *)arena_00->nthreads >> 0x1a) & 0x3ff) == bin_infos[binind].nregs) {
        arena_dalloc_bin_slab(local_60,arena,(extent_t *)arena_00,bin);
        return pvVar14;
      }
      arena_bin_lower_slab((tsdn_t *)arena,arena_00,(extent_t *)bin,(bin_t *)bin_00);
      return pvVar14;
    }
    if (manual_arena_base <= arena->base->ind) {
      peVar8 = (bin->slabs_full).qlh_first;
      if (peVar8 != (extent_t *)0x0) {
        peVar9 = (peVar8->ql_link).qre_prev;
        (peVar6->ql_link).qre_prev = peVar9;
        (peVar6->ql_link).qre_next = peVar8;
        (peVar9->ql_link).qre_next = peVar6;
        (peVar8->ql_link).qre_prev = peVar6;
      }
      (bin->slabs_full).qlh_first = (peVar6->ql_link).qre_next;
    }
    bin->slabcur = (extent_t *)0x0;
  }
  if (arena_00 == (arena_t *)0x0) {
    pvVar14 = (void *)0x0;
  }
  else {
    bin->slabcur = (extent_t *)arena_00;
    pvVar14 = arena_slab_reg_alloc((extent_t *)arena_00,bin_info);
  }
  return pvVar14;
}

Assistant:

static void *
arena_bin_malloc_hard(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, unsigned binshard) {
	const bin_info_t *bin_info;
	extent_t *slab;

	bin_info = &bin_infos[binind];
	if (!arena_is_auto(arena) && bin->slabcur != NULL) {
		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}
	slab = arena_bin_nonfull_slab_get(tsdn, arena, bin, binind, binshard);
	if (bin->slabcur != NULL) {
		/*
		 * Another thread updated slabcur while this one ran without the
		 * bin lock in arena_bin_nonfull_slab_get().
		 */
		if (extent_nfree_get(bin->slabcur) > 0) {
			void *ret = arena_slab_reg_alloc(bin->slabcur,
			    bin_info);
			if (slab != NULL) {
				/*
				 * arena_slab_alloc() may have allocated slab,
				 * or it may have been pulled from
				 * slabs_nonfull.  Therefore it is unsafe to
				 * make any assumptions about how slab has
				 * previously been used, and
				 * arena_bin_lower_slab() must be called, as if
				 * a region were just deallocated from the slab.
				 */
				if (extent_nfree_get(slab) == bin_info->nregs) {
					arena_dalloc_bin_slab(tsdn, arena, slab,
					    bin);
				} else {
					arena_bin_lower_slab(tsdn, arena, slab,
					    bin);
				}
			}
			return ret;
		}

		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}

	if (slab == NULL) {
		return NULL;
	}
	bin->slabcur = slab;

	assert(extent_nfree_get(bin->slabcur) > 0);

	return arena_slab_reg_alloc(slab, bin_info);
}